

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmisc.c
# Opt level: O2

uint pseudo_gen_alloc(PseudoGenerator *generator,_Bool top)

{
  int iVar1;
  uint uVar2;
  int i;
  ulong uVar3;
  undefined7 in_register_00000031;
  int j;
  ulong uVar4;
  bool bVar5;
  
  if ((int)CONCAT71(in_register_00000031,top) == 0) {
    bVar5 = true;
    uVar2 = 0;
    for (uVar3 = 0; (bVar5 && (uVar3 < 4)); uVar3 = uVar3 + 1) {
      if (generator->bits[uVar3] == 0xffffffffffffffff) {
        uVar2 = uVar2 + 0x40;
        bVar5 = true;
      }
      else {
        bVar5 = true;
        for (uVar4 = 0; (bVar5 && (uVar4 < 0x40)); uVar4 = uVar4 + 1) {
          bVar5 = (generator->bits[uVar3] >> (uVar4 & 0x3f) & 1) != 0;
          uVar2 = uVar2 + bVar5;
        }
      }
    }
  }
  else {
    iVar1 = top_reg(generator);
    uVar2 = iVar1 + 1;
  }
  generator->bits[uVar2 >> 6] = generator->bits[uVar2 >> 6] | 1L << ((byte)uVar2 & 0x3f);
  if (uVar2 <= generator->max_reg) {
    if (uVar2 == generator->max_reg) {
      generator->max_reg = uVar2 + 1;
    }
    return uVar2;
  }
  __assert_fail("reg <= generator->max_reg",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/tests/tmisc.c"
                ,0x12e,"unsigned int pseudo_gen_alloc(PseudoGenerator *, _Bool)");
}

Assistant:

static unsigned pseudo_gen_alloc(PseudoGenerator *generator, bool top)
{
	unsigned reg;
	if (top) {
		int current_top = top_reg(generator);
		reg = current_top + 1;
	} else {
		/* look for the first free reg */
		reg = 0;
		int is_set = 1;
		for (int i = 0; is_set && i < N_WORDS; i++) {
			uint64_t bit = generator->bits[i];
			if (bit == ~0ull) {
				/* all bits set? skip */ 
				reg += ESIZE;
				continue;
			} 
			for (int j = 0; is_set && j < ESIZE; j++) {
				is_set = (bit & (1ull << j)) != 0;
				if (is_set)
					reg++;
			}
		}
	}
	unsigned i = reg / ESIZE;
	unsigned j = reg % ESIZE;
	generator->bits[i] |= (1ull << j);
	assert(reg <= generator->max_reg);
	if (reg == generator->max_reg)
		generator->max_reg += 1;
	return reg;
}